

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdeadlinetimer.h
# Opt level: O2

nanoseconds __thiscall QDeadlineTimer::remainingTimeAsDuration(QDeadlineTimer *this)

{
  nanoseconds nVar1;
  
  nVar1.__r = 0x7fffffffffffffff;
  if (this->t1 != 0x7fffffffffffffff) {
    nVar1.__r = QDeadlineTimer::rawRemainingTimeNSecs();
    if (nVar1.__r < 1) {
      nVar1.__r = 0;
    }
  }
  return (nanoseconds)nVar1.__r;
}

Assistant:

std::chrono::nanoseconds remainingTimeAsDuration() const noexcept
    {
        if (isForever())
            return std::chrono::nanoseconds::max();
        qint64 nsecs = rawRemainingTimeNSecs();
        if (nsecs <= 0)
            return std::chrono::nanoseconds::zero();
        return std::chrono::nanoseconds(nsecs);
    }